

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObjectEnumerator.cpp
# Opt level: O2

void __thiscall Js::ES5ArgumentsObjectEnumerator::Reset(ES5ArgumentsObjectEnumerator *this)

{
  Init(this,(EnumeratorCache *)0x0);
  return;
}

Assistant:

void ES5ArgumentsObjectEnumerator::Reset()
    {
        Init(nullptr);
    }